

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O0

CodeLocation __thiscall soul::CodeLocation::createFromSourceFile(CodeLocation *this,SourceFile *f)

{
  UTF8Reader extraout_RDX;
  CodeLocation CVar1;
  string local_58;
  string local_38;
  SourceFile *local_18;
  SourceFile *f_local;
  
  local_18 = f;
  f_local = (SourceFile *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)f);
  std::__cxx11::string::string((string *)&local_58,(string *)&local_18->content);
  createFromString(this,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  CVar1.location.data = extraout_RDX.data;
  CVar1.sourceCode.object = (SourceCodeText *)this;
  return CVar1;
}

Assistant:

CodeLocation CodeLocation::createFromSourceFile (const SourceFile& f)
{
    return createFromString (f.filename, f.content);
}